

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void send_ssi_file(mg_connection *conn,char *path,FILE *fp,int include_level)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  ns_connection *nc;
  char buf [8192];
  char file_name [8192];
  undefined1 auStack_6048 [12];
  int local_603c;
  int local_6038;
  char local_6034;
  undefined4 local_6033;
  undefined3 local_602f;
  undefined1 local_602c [8180];
  char local_4038 [8192];
  undefined1 local_2038 [8200];
  
  if (10 < include_level) {
    mg_printf(conn,"SSI #include level is too deep (%s)",path);
    return;
  }
  iVar3 = fgetc((FILE *)fp);
  if (iVar3 == -1) {
    uVar10 = 0;
  }
  else {
    local_603c = include_level + 1;
    bVar2 = false;
    sVar8 = 0;
    do {
      iVar9 = (int)sVar8;
      if (iVar3 == 0x3e && bVar2) {
        *(undefined2 *)((long)&local_6038 + (long)iVar9) = 0x3e;
        if (0x1fff < iVar9) {
          __assert_fail("len <= (int) sizeof(buf)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x105b,
                        "void send_ssi_file(struct mg_connection *, const char *, FILE *, int)");
        }
        if ((iVar9 < 5) || (local_6034 != '#' || local_6038 != 0x2d2d213c)) {
          sVar8 = (long)iVar9 + 1;
          nc = (ns_connection *)conn[-1].callback_param;
LAB_0010ad75:
          ns_out(nc,&local_6038,sVar8);
        }
        else if (CONCAT31(local_602f,local_6033._3_1_) == 0x6564756c && local_6033 == 0x6c636e69) {
          pcVar7 = conn[1].request_method;
          iVar3 = __isoc99_sscanf(local_602c," virtual=\"%[^\"]\"",local_2038);
          if (iVar3 == 1) {
            mg_snprintf(local_4038,0x2000,"%s%c%s",*(undefined8 *)(pcVar7 + 0x68),0x2f,local_2038);
          }
          else {
            iVar3 = __isoc99_sscanf(local_602c," abspath=\"%[^\"]\"",local_2038);
            if (iVar3 == 1) {
              sVar8 = 0x2000;
              puVar1 = auStack_6048;
            }
            else {
              iVar3 = __isoc99_sscanf(local_602c," file=\"%[^\"]\"",local_2038);
              if ((iVar3 != 1) &&
                 (iVar3 = __isoc99_sscanf(local_602c," \"%[^\"]\"",local_2038), iVar3 != 1)) {
                mg_printf(conn,"Bad SSI #include: [%s]",local_602c);
                goto LAB_0010ad81;
              }
              mg_snprintf(local_4038,0x2000,"%s",path);
              pcVar4 = strrchr(local_4038,0x2f);
              if (pcVar4 != (char *)0x0) {
                pcVar4[1] = '\0';
              }
              sVar5 = strlen(local_4038);
              puVar1 = auStack_6048 + sVar5;
              sVar8 = 0x2000 - sVar5;
            }
            mg_snprintf(puVar1 + 0x2010,sVar8,"%s",local_2038);
          }
          __stream = fopen64(local_4038,"rb");
          if (__stream == (FILE *)0x0) {
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            mg_printf(conn,"Cannot open SSI #include: [%s]: fopen(%s): %s",local_602c,local_4038,
                      pcVar7);
          }
          else {
            iVar3 = fileno(__stream);
            fcntl64(iVar3,2,1);
            pcVar7 = *(char **)(pcVar7 + 0xb8);
            sVar5 = strlen(pcVar7);
            iVar3 = mg_match_prefix(pcVar7,(int)sVar5,local_4038);
            if (iVar3 < 1) {
              send_file_data(conn,(FILE *)__stream);
            }
            else {
              send_ssi_file(conn,local_4038,(FILE *)__stream,local_603c);
            }
            fclose(__stream);
          }
        }
        else if (local_6033 == 0x63657865) {
          do_ssi_exec(conn,(char *)&local_602f);
        }
        else {
          mg_printf(conn,"%s: unknown SSI command: \"%s\"",path,&local_6038);
        }
LAB_0010ad81:
        sVar8 = 0;
        bVar2 = false;
      }
      else if (bVar2) {
        bVar2 = true;
        if (iVar9 == 0x1ffe) {
          iVar9 = 0;
          mg_printf(conn,"%s: SSI tag is too large",path);
        }
        else if ((iVar9 == 5) && (local_6034 != '#' || local_6038 != 0x2d2d213c)) {
          bVar2 = false;
          iVar9 = 5;
        }
        sVar8 = (size_t)(iVar9 + 1);
        *(char *)((long)&local_6038 + (long)iVar9) = (char)iVar3;
      }
      else if (iVar3 == 0x3c) {
        if (0 < iVar9) {
          ns_out((ns_connection *)conn[-1].callback_param,&local_6038,sVar8);
        }
        local_6038 = CONCAT31(local_6038._1_3_,0x3c);
        sVar8 = 1;
        bVar2 = true;
      }
      else {
        sVar8 = (size_t)(iVar9 + 1U);
        *(char *)((long)&local_6038 + (long)iVar9) = (char)iVar3;
        bVar2 = false;
        if (iVar9 + 1U == 0x2000) {
          nc = (ns_connection *)conn[-1].callback_param;
          sVar8 = 0x2000;
          goto LAB_0010ad75;
        }
      }
      uVar10 = (uint)sVar8;
      iVar3 = fgetc((FILE *)fp);
    } while (iVar3 != -1);
  }
  if (0 < (int)uVar10) {
    ns_out((ns_connection *)conn[-1].callback_param,&local_6038,(ulong)uVar10);
  }
  return;
}

Assistant:

static void send_ssi_file(struct mg_connection *conn, const char *path,
                          FILE *fp, int include_level) {
  char buf[IOBUF_SIZE];
  int ch, offset, len, in_ssi_tag;

  if (include_level > 10) {
    mg_printf(conn, "SSI #include level is too deep (%s)", path);
    return;
  }

  in_ssi_tag = len = offset = 0;
  while ((ch = fgetc(fp)) != EOF) {
    if (in_ssi_tag && ch == '>') {
      in_ssi_tag = 0;
      buf[len++] = (char) ch;
      buf[len] = '\0';
      assert(len <= (int) sizeof(buf));
      if (len < 6 || memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag, pass it
        (void) mg_write(conn, buf, (size_t) len);
      } else {
        if (!memcmp(buf + 5, "include", 7)) {
          do_ssi_include(conn, path, buf + 12, include_level);
#if !defined(MONGOOSE_NO_POPEN)
        } else if (!memcmp(buf + 5, "exec", 4)) {
          do_ssi_exec(conn, buf + 9);
#endif // !NO_POPEN
        } else {
          mg_printf(conn, "%s: unknown SSI " "command: \"%s\"", path, buf);
        }
      }
      len = 0;
    } else if (in_ssi_tag) {
      if (len == 5 && memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag
        in_ssi_tag = 0;
      } else if (len == (int) sizeof(buf) - 2) {
        mg_printf(conn, "%s: SSI tag is too large", path);
        len = 0;
      }
      buf[len++] = ch & 0xff;
    } else if (ch == '<') {
      in_ssi_tag = 1;
      if (len > 0) {
        mg_write(conn, buf, (size_t) len);
      }
      len = 0;
      buf[len++] = ch & 0xff;
    } else {
      buf[len++] = ch & 0xff;
      if (len == (int) sizeof(buf)) {
        mg_write(conn, buf, (size_t) len);
        len = 0;
      }
    }
  }

  // Send the rest of buffered data
  if (len > 0) {
    mg_write(conn, buf, (size_t) len);
  }
}